

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void tx_search_best_inter_candidates
               (AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int64_t best_rd_so_far,
               BLOCK_SIZE bsize,buf_2d (*yv12_mb) [3],int mi_row,int mi_col,
               InterModeSearchState *search_state,RD_STATS *rd_cost,PICK_MODE_CONTEXT *ctx,
               int64_t *yrd)

{
  char cVar1;
  undefined8 uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  MACROBLOCK *pMVar8;
  MACROBLOCK *in_RCX;
  long lVar9;
  undefined8 *puVar10;
  long in_RDX;
  long in_RDI;
  BLOCK_SIZE in_R8B;
  long in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000030;
  int qindex_band_cmp;
  int max_cands_cap_cmp [2] [4];
  int aggr;
  int qindex_band;
  int max_cands_cap [5];
  int txfm_search_done;
  THR_MODES mode_enum;
  int y_rate;
  int64_t this_yrd;
  int eval_txfm;
  int64_t curr_sse;
  int txfm_rd_gate_level;
  int64_t skip_rd;
  int mode_rate;
  RD_STATS rd_stats_uv;
  RD_STATS rd_stats_y;
  RD_STATS rd_stats;
  _Bool is_predictor_built;
  int i;
  int is_comp_pred;
  int64_t curr_est_rd;
  PREDICTION_MODE prediction_mode;
  int data_idx;
  int j;
  int num_tx_search_modes [12];
  int num_tx_cands;
  int num_mode_thresh_ary [4];
  int num_mode_thresh;
  int num_allowed_cands [5];
  int max_allowed_cands;
  int newmv_mode_evaled;
  int num_inter_mode_cands;
  int64_t best_rd_in_this_partition;
  int64_t top_est_rd;
  InterModesInfo *inter_modes_info;
  MB_MODE_INFO *mbmi;
  int skip_ctx;
  int num_planes;
  ModeCosts *mode_costs;
  TxfmSearchInfo *txfm_info;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffd58;
  uint uVar11;
  undefined4 in_stack_fffffffffffffd5c;
  InterModesInfo *in_stack_fffffffffffffd60;
  long best_skip_rd;
  uint uVar12;
  undefined4 in_stack_fffffffffffffd6c;
  MACROBLOCK *x_00;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  AV1_COMMON *new_best_rd_stats;
  MACROBLOCKD *ctx_00;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffffdb4;
  RD_STATS *in_stack_fffffffffffffdb8;
  RD_STATS *rd_cost_uv;
  undefined4 in_stack_fffffffffffffdc0;
  int plane_from;
  int in_stack_fffffffffffffdc4;
  MACROBLOCK *in_stack_fffffffffffffdc8;
  MB_MODE_INFO *in_stack_fffffffffffffdd0;
  MACROBLOCK *in_stack_fffffffffffffdd8;
  AV1_COMMON *in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffdf0;
  MACROBLOCKD *in_stack_fffffffffffffdf8;
  AV1_COMMON *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  uint in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  RD_STATS *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  uint uVar16;
  AV1_COMP *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffe68;
  int local_190;
  long local_188;
  int local_168;
  long local_160;
  char local_148;
  int local_138;
  int local_11c;
  int local_118 [15];
  int local_dc;
  int local_d8 [7];
  int local_bc;
  int local_b8 [7];
  int local_9c;
  int local_98;
  int local_94;
  MACROBLOCK *local_90;
  RD_STATS *local_88;
  int *local_80;
  MB_MODE_INFO *local_78;
  int local_70;
  int local_6c;
  long local_68;
  undefined1 *local_60;
  MACROBLOCKD *local_58;
  AV1_COMMON *local_50;
  long local_48;
  BLOCK_SIZE local_39;
  MACROBLOCK *local_38;
  long local_30;
  long local_20;
  
  local_50 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_58 = (MACROBLOCKD *)(in_RDX + 0x1a0);
  local_60 = (undefined1 *)(in_RDX + 0x24e08);
  local_68 = in_RDX + 0x4230;
  local_48 = in_R9;
  local_39 = in_R8B;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_20 = in_RDI;
  local_6c = av1_num_planes(local_50);
  local_70 = av1_get_skip_txfm_context(local_58);
  local_78 = *local_58->mi;
  local_80 = *(int **)(local_30 + 0x1c640);
  inter_modes_info_sort
            (in_stack_fffffffffffffd60,
             (RdIdxPair *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  *in_stack_00000018 = (long)local_38;
  *(undefined1 *)(in_stack_00000018 + 0x1b) = 0xff;
  *(undefined4 *)(local_30 + 0x1c638) = 0;
  uVar11 = 0xff;
  best_skip_rd = 0;
  uVar12 = (uint)local_39;
  uVar4 = (uint)*(byte *)(local_20 + 0x60c40);
  uVar13 = 0;
  store_winner_mode_stats
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (RD_STATS *)in_stack_fffffffffffffdc8,
             (RD_STATS *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8,(THR_MODES)in_stack_fffffffffffffdf0,
             (uint8_t *)in_stack_fffffffffffffdf8,(BLOCK_SIZE)in_stack_fffffffffffffe00,
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),in_stack_fffffffffffffe10
             ,in_stack_fffffffffffffe18);
  if (*local_80 < *(int *)(local_20 + 0x60cd4)) {
    plane_from = *local_80;
  }
  else {
    plane_from = *(int *)(local_20 + 0x60cd4);
  }
  *local_80 = plane_from;
  if (*local_80 < 1) {
    rd_cost_uv = (RD_STATS *)0x7fffffffffffffff;
  }
  else {
    rd_cost_uv = *(RD_STATS **)(local_80 + (long)local_80[0xc402] * 2 + 0xbc02);
  }
  local_88 = rd_cost_uv;
  *in_stack_00000030 = 0x7fffffffffffffff;
  local_90 = (MACROBLOCK *)0x7fffffffffffffff;
  local_94 = *local_80;
  local_98 = 0;
  local_9c = 0x7fffffff;
  if (*(int *)(local_20 + 0x60b30) != 0) {
    local_b8[0] = 0x7fffffff;
    local_b8[1] = 10;
    local_b8[2] = 9;
    local_b8[3] = 6;
    local_b8[4] = 2;
    local_9c = local_b8[*(int *)(local_20 + 0x60b30)];
  }
  local_bc = 0x7fffffff;
  if (*(int *)(local_20 + 0x60b34) != 0) {
    local_d8[0] = 0x7fffffff;
    local_d8[1] = 4;
    local_d8[2] = 3;
    local_d8[3] = 0;
    local_bc = local_d8[*(int *)(local_20 + 0x60b34)];
  }
  local_dc = 0;
  memset(local_118,0,0x30);
  local_11c = 0;
  x_00 = local_38;
  do {
    if (local_94 <= local_11c) {
      return;
    }
    iVar6 = local_80[(long)local_11c * 4 + 0xc402];
    memcpy(local_78,local_80 + (long)iVar6 * 0x2c + 2,0xb0);
    bVar3 = local_78->mode;
    if ((double)(long)local_88 < (double)*(long *)(local_80 + (long)iVar6 * 2 + 0xbc02) * 0.8) {
      return;
    }
    if ((local_dc <= local_bc) ||
       (((bVar3 == 0xd || (local_118[(int)(bVar3 - 0xd)] < 1)) &&
        ((bVar3 != 0xd || (local_118[0] < 2)))))) {
      *local_60 = 0;
      set_ref_ptrs((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffd84,uVar13),
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd7c,uVar4),
                   (MV_REFERENCE_FRAME)((ulong)x_00 >> 0x38),
                   (MV_REFERENCE_FRAME)((ulong)x_00 >> 0x30));
      cVar1 = local_78->ref_frame[1];
      for (local_138 = 0; local_138 < local_6c; local_138 = local_138 + 1) {
        lVar9 = (long)local_138;
        puVar10 = (undefined8 *)
                  (local_48 + (long)local_78->ref_frame[0] * 0x60 + (long)local_138 * 0x20);
        local_58->plane[lVar9].pre[0].buf = (uint8_t *)*puVar10;
        ((INTERINTER_COMPOUND_DATA *)&local_58->plane[lVar9].pre[0].buf0)->seg_mask =
             (uint8_t *)puVar10[1];
        uVar2 = puVar10[2];
        local_58->plane[lVar9].pre[0].width = (int)uVar2;
        local_58->plane[lVar9].pre[0].height = (int)((ulong)uVar2 >> 0x20);
        *(undefined8 *)&local_58->plane[lVar9].pre[0].stride = puVar10[3];
        if ('\0' < cVar1) {
          lVar9 = (long)local_138;
          puVar10 = (undefined8 *)
                    (local_48 + (long)local_78->ref_frame[1] * 0x60 + (long)local_138 * 0x20);
          local_58->plane[lVar9].pre[1].buf = (uint8_t *)*puVar10;
          local_58->plane[lVar9].pre[1].buf0 = (uint8_t *)puVar10[1];
          uVar2 = puVar10[2];
          local_58->plane[lVar9].pre[1].width = (int)uVar2;
          local_58->plane[lVar9].pre[1].height = (int)((ulong)uVar2 >> 0x20);
          *(undefined8 *)&local_58->plane[lVar9].pre[1].stride = puVar10[3];
        }
      }
      uVar16 = local_80[(long)iVar6 + 0xb002];
      lVar9 = 0x7fffffffffffffff;
      iVar5 = get_txfm_rd_gate_level
                        ((uint)local_50->seq_params->enable_masked_compound,
                         (int *)(local_20 + 0x60a78),local_39,'\0',0);
      if (iVar5 != 0) {
        in_stack_fffffffffffffe28 = *(RD_STATS **)(local_80 + (long)iVar6 * 2 + 0xb402);
        lVar9 = ((long)(int)uVar16 * (long)*(int *)(local_30 + 0x4218) + 0x100 >> 9) +
                (long)in_stack_fffffffffffffe28 * 0x80;
        in_stack_fffffffffffffe24 =
             check_txfm_eval(x_00,(BLOCK_SIZE)((uint)in_stack_fffffffffffffd6c >> 0x18),best_skip_rd
                             ,CONCAT44(in_stack_fffffffffffffd5c,uVar11),0,0x1340899);
        if (in_stack_fffffffffffffe24 == 0) goto LAB_01340ee1;
      }
      uVar11 = uVar16;
      in_stack_fffffffffffffdb4 = CONCAT13(local_39,(int3)in_stack_fffffffffffffdb4);
      new_best_rd_stats = local_50;
      ctx_00 = local_58;
      uVar14 = in_stack_00000008;
      uVar15 = in_stack_00000010;
      av1_num_planes(local_50);
      av1_enc_build_inter_predictor
                ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffdb4,uVar15),
                 (MACROBLOCKD *)CONCAT44(uVar14,in_stack_fffffffffffffda8),
                 (int)((ulong)ctx_00 >> 0x20),(int)ctx_00,(BUFFER_SET *)new_best_rd_stats,
                 (BLOCK_SIZE)((uint)in_stack_fffffffffffffd94 >> 0x18),plane_from,
                 (int)in_stack_fffffffffffffdc8);
      if (local_78->motion_mode == '\x01') {
        av1_build_obmc_inter_predictors_sb(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
      local_dc = local_dc + 1;
      iVar6 = have_newmv_in_inter_mode(bVar3);
      if (iVar6 != 0) {
        local_98 = 1;
      }
      local_118[(int)(bVar3 - 0xd)] = local_118[(int)(bVar3 - 0xd)] + 1;
      best_skip_rd = *in_stack_00000018;
      uVar16 = uVar11;
      iVar6 = av1_txfm_search(in_stack_fffffffffffffe48,
                              (MACROBLOCK *)CONCAT44(uVar11,in_stack_fffffffffffffe40),
                              (BLOCK_SIZE)((ulong)lVar9 >> 0x38),
                              (RD_STATS *)CONCAT44(iVar5,in_stack_fffffffffffffe30),
                              in_stack_fffffffffffffe28,
                              (RD_STATS *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
      if (iVar6 != 0) {
        if (local_148 == '\0') {
          in_stack_fffffffffffffd94 = local_190 + *(int *)(local_68 + 0x4a50 + (long)local_70 * 8);
        }
        else {
          in_stack_fffffffffffffd94 = *(int *)(local_68 + 0x4a54 + (long)local_70 * 8);
        }
        lVar7 = ((long)(int)(in_stack_fffffffffffffd94 + uVar16) * (long)*(int *)(local_30 + 0x4218)
                 + 0x100 >> 9) + local_188 * 0x80;
        if (*(int *)(local_20 + 0x60a74) == 1) {
          inter_mode_data_push
                    ((TileDataEnc *)CONCAT44(in_stack_fffffffffffffd84,uVar13),
                     (BLOCK_SIZE)((uint)in_stack_fffffffffffffd7c >> 0x18),(int64_t)x_00,
                     CONCAT44(in_stack_fffffffffffffd6c,uVar12),(int)((ulong)best_skip_rd >> 0x20));
        }
        pMVar8 = (MACROBLOCK *)
                 (((long)local_168 * (long)*(int *)(local_30 + 0x4218) + 0x100 >> 9) +
                 local_160 * 0x80);
        if ((long)pMVar8 < (long)local_90) {
          *in_stack_00000030 = lVar7;
          local_90 = pMVar8;
        }
        bVar3 = get_prediction_mode_idx(bVar3,local_78->ref_frame[0],local_78->ref_frame[1]);
        in_stack_fffffffffffffe10 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe10);
        uVar11 = (uint)bVar3;
        best_skip_rd = 0;
        uVar12 = (uint)local_39;
        uVar4 = (uint)*(byte *)(local_20 + 0x60c40);
        uVar13 = 1;
        x_00 = pMVar8;
        store_winner_mode_stats
                  (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                   (RD_STATS *)in_stack_fffffffffffffdc8,
                   (RD_STATS *)CONCAT44(in_stack_fffffffffffffdc4,plane_from),rd_cost_uv,
                   (THR_MODES)in_stack_fffffffffffffdf0,(uint8_t *)in_stack_fffffffffffffdf8,
                   (BLOCK_SIZE)in_stack_fffffffffffffe00,CONCAT44(1,in_stack_fffffffffffffe08),
                   in_stack_fffffffffffffe10,(int)lVar7);
        if ((long)pMVar8 < *in_stack_00000018) {
          uVar11 = in_stack_fffffffffffffe10 >> 0x18;
          uVar12 = 1;
          best_skip_rd = local_30;
          update_search_state((InterModeSearchState *)CONCAT44(in_stack_fffffffffffffdb4,uVar15),
                              (RD_STATS *)CONCAT44(uVar14,in_stack_fffffffffffffda8),
                              (PICK_MODE_CONTEXT *)ctx_00,(RD_STATS *)new_best_rd_stats,
                              (RD_STATS *)
                              CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                              (RD_STATS *)
                              CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                              (THR_MODES)plane_from,in_stack_fffffffffffffdc8,
                              (int)in_stack_fffffffffffffdd0);
          in_stack_00000018[1] = lVar9;
          if (*(int *)(local_20 + 0x60b2c) != 0) {
            if ((local_11c == 0) && (((char)in_stack_00000018[0x15] != '\0' || (local_148 != '\0')))
               ) {
              in_stack_fffffffffffffdf8 = (MACROBLOCKD *)0x300000002;
              in_stack_fffffffffffffe00 = (AV1_COMMON *)0x700000005;
              in_stack_fffffffffffffe08 = 9;
              iVar6 = *(int *)(local_30 + 0x4208) * 5 >> 8;
              if (*(int *)(&stack0xfffffffffffffdf8 + (long)iVar6 * 4) < *local_80) {
                in_stack_fffffffffffffd90 = *(int *)(&stack0xfffffffffffffdf8 + (long)iVar6 * 4);
                local_94 = in_stack_fffffffffffffd90;
              }
              else {
                in_stack_fffffffffffffd90 = *local_80;
                local_94 = in_stack_fffffffffffffd90;
              }
            }
            else if ((local_11c == 0) &&
                    (iVar6 = has_second_ref((MB_MODE_INFO *)(in_stack_00000018 + 3)), iVar6 != 0)) {
              in_stack_fffffffffffffdf0 = *(int *)(local_20 + 0x60b2c) + -1;
              in_stack_fffffffffffffdc8 = (MACROBLOCK *)0x70000000a;
              in_stack_fffffffffffffdd0 = (MB_MODE_INFO *)0x400000005;
              in_stack_fffffffffffffdd8 = (MACROBLOCK *)0x70000000a;
              in_stack_fffffffffffffde0 = (AV1_COMMON *)0x300000005;
              in_stack_fffffffffffffdc4 = (*(int *)(local_30 + 0x4208) << 2) >> 8;
              if (*(int *)(&stack0xfffffffffffffdc8 +
                          (long)in_stack_fffffffffffffdc4 * 4 +
                          (long)in_stack_fffffffffffffdf0 * 0x10) < *local_80) {
                in_stack_fffffffffffffd8c =
                     *(int *)(&stack0xfffffffffffffdc8 +
                             (long)in_stack_fffffffffffffdc4 * 4 +
                             (long)in_stack_fffffffffffffdf0 * 0x10);
                local_94 = in_stack_fffffffffffffd8c;
              }
              else {
                in_stack_fffffffffffffd8c = *local_80;
                local_94 = in_stack_fffffffffffffd8c;
              }
            }
          }
        }
        if ((local_9c < local_dc) && (local_98 != 0)) {
          return;
        }
      }
    }
LAB_01340ee1:
    local_11c = local_11c + 1;
  } while( true );
}

Assistant:

static void tx_search_best_inter_candidates(
    AV1_COMP *cpi, TileDataEnc *tile_data, MACROBLOCK *x,
    int64_t best_rd_so_far, BLOCK_SIZE bsize,
    struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE], int mi_row, int mi_col,
    InterModeSearchState *search_state, RD_STATS *rd_cost,
    PICK_MODE_CONTEXT *ctx, int64_t *yrd) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int num_planes = av1_num_planes(cm);
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  MB_MODE_INFO *const mbmi = xd->mi[0];
  InterModesInfo *inter_modes_info = x->inter_modes_info;
  inter_modes_info_sort(inter_modes_info, inter_modes_info->rd_idx_pair_arr);
  search_state->best_rd = best_rd_so_far;
  search_state->best_mode_index = THR_INVALID;
  // Initialize best mode stats for winner mode processing
  x->winner_mode_count = 0;
  store_winner_mode_stats(&cpi->common, x, mbmi, NULL, NULL, NULL, THR_INVALID,
                          NULL, bsize, best_rd_so_far,
                          cpi->sf.winner_mode_sf.multi_winner_mode_type, 0);
  inter_modes_info->num =
      inter_modes_info->num < cpi->sf.rt_sf.num_inter_modes_for_tx_search
          ? inter_modes_info->num
          : cpi->sf.rt_sf.num_inter_modes_for_tx_search;
  const int64_t top_est_rd =
      inter_modes_info->num > 0
          ? inter_modes_info
                ->est_rd_arr[inter_modes_info->rd_idx_pair_arr[0].idx]
          : INT64_MAX;
  *yrd = INT64_MAX;
  int64_t best_rd_in_this_partition = INT64_MAX;
  int num_inter_mode_cands = inter_modes_info->num;
  int newmv_mode_evaled = 0;
  int max_allowed_cands = INT_MAX;
  if (cpi->sf.inter_sf.limit_inter_mode_cands) {
    // The bound on the no. of inter mode candidates, beyond which the
    // candidates are limited if a newmv mode got evaluated, is set as
    // max_allowed_cands + 1.
    const int num_allowed_cands[5] = { INT_MAX, 10, 9, 6, 2 };
    assert(cpi->sf.inter_sf.limit_inter_mode_cands <= 4);
    max_allowed_cands =
        num_allowed_cands[cpi->sf.inter_sf.limit_inter_mode_cands];
  }

  int num_mode_thresh = INT_MAX;
  if (cpi->sf.inter_sf.limit_txfm_eval_per_mode) {
    // Bound the no. of transform searches per prediction mode beyond a
    // threshold.
    const int num_mode_thresh_ary[4] = { INT_MAX, 4, 3, 0 };
    assert(cpi->sf.inter_sf.limit_txfm_eval_per_mode <= 3);
    num_mode_thresh =
        num_mode_thresh_ary[cpi->sf.inter_sf.limit_txfm_eval_per_mode];
  }

  int num_tx_cands = 0;
  int num_tx_search_modes[INTER_MODE_END - INTER_MODE_START] = { 0 };
  // Iterate over best inter mode candidates and perform tx search
  for (int j = 0; j < num_inter_mode_cands; ++j) {
    const int data_idx = inter_modes_info->rd_idx_pair_arr[j].idx;
    *mbmi = inter_modes_info->mbmi_arr[data_idx];
    const PREDICTION_MODE prediction_mode = mbmi->mode;
    int64_t curr_est_rd = inter_modes_info->est_rd_arr[data_idx];
    if (curr_est_rd * 0.80 > top_est_rd) break;

    if (num_tx_cands > num_mode_thresh) {
      if ((prediction_mode != NEARESTMV &&
           num_tx_search_modes[prediction_mode - INTER_MODE_START] >= 1) ||
          (prediction_mode == NEARESTMV &&
           num_tx_search_modes[prediction_mode - INTER_MODE_START] >= 2))
        continue;
    }

    txfm_info->skip_txfm = 0;
    set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);

    // Select prediction reference frames.
    const int is_comp_pred = mbmi->ref_frame[1] > INTRA_FRAME;
    for (int i = 0; i < num_planes; i++) {
      xd->plane[i].pre[0] = yv12_mb[mbmi->ref_frame[0]][i];
      if (is_comp_pred) xd->plane[i].pre[1] = yv12_mb[mbmi->ref_frame[1]][i];
    }

    bool is_predictor_built = false;

    // Initialize RD stats
    RD_STATS rd_stats;
    RD_STATS rd_stats_y;
    RD_STATS rd_stats_uv;
    const int mode_rate = inter_modes_info->mode_rate_arr[data_idx];
    int64_t skip_rd = INT64_MAX;
    const int txfm_rd_gate_level = get_txfm_rd_gate_level(
        cm->seq_params->enable_masked_compound,
        cpi->sf.inter_sf.txfm_rd_gate_level, bsize, TX_SEARCH_DEFAULT,
        /*eval_motion_mode=*/0);
    if (txfm_rd_gate_level) {
      // Check if the mode is good enough based on skip RD
      int64_t curr_sse = inter_modes_info->sse_arr[data_idx];
      skip_rd = RDCOST(x->rdmult, mode_rate, curr_sse);
      int eval_txfm = check_txfm_eval(x, bsize, search_state->best_skip_rd[0],
                                      skip_rd, txfm_rd_gate_level, 0);
      if (!eval_txfm) continue;
    }

    // Build the prediction for this mode
    if (!is_predictor_built) {
      av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                    av1_num_planes(cm) - 1);
    }
    if (mbmi->motion_mode == OBMC_CAUSAL) {
      av1_build_obmc_inter_predictors_sb(cm, xd);
    }

    num_tx_cands++;
    if (have_newmv_in_inter_mode(prediction_mode)) newmv_mode_evaled = 1;
    num_tx_search_modes[prediction_mode - INTER_MODE_START]++;
    int64_t this_yrd = INT64_MAX;
    // Do the transform search
    if (!av1_txfm_search(cpi, x, bsize, &rd_stats, &rd_stats_y, &rd_stats_uv,
                         mode_rate, search_state->best_rd)) {
      continue;
    } else {
      const int y_rate =
          rd_stats.skip_txfm
              ? mode_costs->skip_txfm_cost[skip_ctx][1]
              : (rd_stats_y.rate + mode_costs->skip_txfm_cost[skip_ctx][0]);
      this_yrd = RDCOST(x->rdmult, y_rate + mode_rate, rd_stats_y.dist);

      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        inter_mode_data_push(
            tile_data, mbmi->bsize, rd_stats.sse, rd_stats.dist,
            rd_stats_y.rate + rd_stats_uv.rate +
                mode_costs->skip_txfm_cost[skip_ctx][mbmi->skip_txfm]);
      }
    }
    rd_stats.rdcost = RDCOST(x->rdmult, rd_stats.rate, rd_stats.dist);
    if (rd_stats.rdcost < best_rd_in_this_partition) {
      best_rd_in_this_partition = rd_stats.rdcost;
      *yrd = this_yrd;
    }

    const THR_MODES mode_enum = get_prediction_mode_idx(
        prediction_mode, mbmi->ref_frame[0], mbmi->ref_frame[1]);

    // Collect mode stats for multiwinner mode processing
    const int txfm_search_done = 1;
    store_winner_mode_stats(
        &cpi->common, x, mbmi, &rd_stats, &rd_stats_y, &rd_stats_uv, mode_enum,
        NULL, bsize, rd_stats.rdcost,
        cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);

    if (rd_stats.rdcost < search_state->best_rd) {
      update_search_state(search_state, rd_cost, ctx, &rd_stats, &rd_stats_y,
                          &rd_stats_uv, mode_enum, x, txfm_search_done);
      search_state->best_skip_rd[0] = skip_rd;
      // Limit the total number of modes to be evaluated if the first is valid
      // and transform skip or compound
      if (cpi->sf.inter_sf.inter_mode_txfm_breakout) {
        if (!j && (search_state->best_mbmode.skip_txfm || rd_stats.skip_txfm)) {
          // Evaluate more candidates at high quantizers where occurrence of
          // transform skip is high.
          const int max_cands_cap[5] = { 2, 3, 5, 7, 9 };
          const int qindex_band = (5 * x->qindex) >> QINDEX_BITS;
          num_inter_mode_cands =
              AOMMIN(max_cands_cap[qindex_band], inter_modes_info->num);
        } else if (!j && has_second_ref(&search_state->best_mbmode)) {
          const int aggr = cpi->sf.inter_sf.inter_mode_txfm_breakout - 1;
          // Evaluate more candidates at low quantizers where occurrence of
          // single reference mode is high.
          const int max_cands_cap_cmp[2][4] = { { 10, 7, 5, 4 },
                                                { 10, 7, 5, 3 } };
          const int qindex_band_cmp = (4 * x->qindex) >> QINDEX_BITS;
          num_inter_mode_cands = AOMMIN(
              max_cands_cap_cmp[aggr][qindex_band_cmp], inter_modes_info->num);
        }
      }
    }
    // If the number of candidates evaluated exceeds max_allowed_cands, break if
    // a newmv mode was evaluated already.
    if ((num_tx_cands > max_allowed_cands) && newmv_mode_evaled) break;
  }
}